

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::CordFieldGenerator::GenerateByteSize
          (CordFieldGenerator *this,Printer *printer)

{
  undefined1 local_40 [8];
  Formatter format;
  Printer *printer_local;
  CordFieldGenerator *this_local;
  
  format.vars_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)printer;
  Formatter::Formatter((Formatter *)local_40,printer,&(this->super_FieldGeneratorBase).variables_);
  Formatter::operator()<>
            ((Formatter *)local_40,
             "total_size += $tag_size$ +\n  $pbi$::WireFormatLite::$declared_type$Size(\n    this_._internal_$name$());\n"
            );
  Formatter::~Formatter((Formatter *)local_40);
  return;
}

Assistant:

void CordFieldGenerator::GenerateByteSize(io::Printer* printer) const {
  Formatter format(printer, variables_);
  format(
      "total_size += $tag_size$ +\n"
      "  $pbi$::WireFormatLite::$declared_type$Size(\n"
      "    this_._internal_$name$());\n");
}